

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::do_timer(Server *this)

{
  int iVar1;
  char *pcVar2;
  itimerspec it;
  
  iVar1 = timerfd_create(1,0x800);
  this->timer_fd = iVar1;
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x4b);
    pcVar2 = "this->timer_fd";
  }
  else {
    iVar1 = clock_gettime(1,(timespec *)&it.it_value);
    if (-1 < iVar1) {
      it.it_value.tv_sec = 1;
      it.it_value.tv_nsec = 0;
      it.it_interval.tv_sec = 1;
      it.it_interval.tv_nsec = 0;
      timerfd_settime(this->timer_fd,0,(itimerspec *)&it,(itimerspec *)0x0);
      return;
    }
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x4d);
    pcVar2 = "clock_gettime(CLOCK_MONOTONIC, &it.it_value)";
  }
  fprintf(_stderr,"--> %s\n",pcVar2);
  perror("info");
  exit(1);
}

Assistant:

void Server::do_timer() {
    this->timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK);
    IF_NEGATIVE_EXIT(this->timer_fd);
    struct itimerspec it;
    IF_NEGATIVE_EXIT(clock_gettime(CLOCK_MONOTONIC, &it.it_value));
    it.it_value.tv_sec = 1;
    it.it_value.tv_nsec = 0;
    it.it_interval.tv_sec = 1;
    it.it_interval.tv_nsec = 0;
    timerfd_settime(this->timer_fd, 0, &it, NULL);
}